

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryPropertyDescriptor.h
# Opt level: O2

int __thiscall
Js::DictionaryPropertyDescriptor<int>::GetDataPropertyIndex<true>
          (DictionaryPropertyDescriptor<int> *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  char *message;
  char *error;
  uint lineNumber;
  
  if ((this->Attributes & 0x10) == 0) {
    if (((this->flags & IsAccessor) == None) || (this->Data == -1)) goto LAB_00c3287a;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    error = "(!GetIsAccessor() || this->Data == NoSlots)";
    message = "!GetIsAccessor() || this->Data == NoSlots";
    lineNumber = 0xc1;
  }
  else {
    if (this->Data != -1) goto LAB_00c3287a;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    error = "(this->Data != NoSlots)";
    message = "this->Data != NoSlots";
    lineNumber = 0xb3;
  }
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/DictionaryPropertyDescriptor.h"
                              ,lineNumber,error,message);
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar3 = 0;
LAB_00c3287a:
  return this->Data;
}

Assistant:

TPropertyIndex DictionaryPropertyDescriptor<TPropertyIndex>::GetDataPropertyIndex() const
    {
        // If it is let const global, the data slot is the let const property, and if we allow let const global,
        // we already return that the Getter/Setter slot may be doubled as the Data Slot
        // so only return it if we allow let const
        bool const isLetConstGlobal = (this->Attributes & PropertyLetConstGlobal) != 0;
        if (isLetConstGlobal)
        {
            Assert(this->Data != NoSlots);  // Should always have slot for LetConstGlobal if specified
            if (allowLetConstGlobal)
            {
                return this->Data;
            }
            else if (GetIsShadowed() && !GetIsAccessor())
            {
                // if it is a let const global, if the setter slot is empty, then the Getter slot must be
                // the shadowed data slot, return that.
                return this->Getter;
            }
        }
        else
        {
            Assert(!GetIsAccessor() || this->Data == NoSlots);
            return this->Data;
        }
        return NoSlots;
    }